

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

void __thiscall
duckdb::ConcurrentQueue::Enqueue
          (ConcurrentQueue *this,ProducerToken *token,shared_ptr<duckdb::Task,_true> *task)

{
  bool bVar1;
  Task *pTVar2;
  pointer pQVar3;
  InternalException *this_00;
  __sighandler_t __handler;
  allocator local_49;
  string local_48;
  
  ::std::mutex::lock(&token->producer_lock);
  pTVar2 = shared_ptr<duckdb::Task,_true>::operator->(task);
  (pTVar2->token).ptr = token;
  pQVar3 = unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>,_true>
           ::operator->(&token->token);
  bVar1 = duckdb_moodycamel::
          ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::ExplicitProducer::
          enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::shared_ptr<duckdb::Task,true>>
                    ((ExplicitProducer *)&(pQVar3->queue_token).producer[-1].token,task);
  if (bVar1) {
    duckdb_moodycamel::LightweightSemaphore::signal(&this->semaphore,1,__handler);
    pthread_mutex_unlock((pthread_mutex_t *)&token->producer_lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_48,"Could not schedule task!",&local_49);
  InternalException::InternalException(this_00,&local_48);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ConcurrentQueue::Enqueue(ProducerToken &token, shared_ptr<Task> task) {
	lock_guard<mutex> producer_lock(token.producer_lock);
	task->token = token;
	if (q.enqueue(token.token->queue_token, std::move(task))) {
		semaphore.signal();
	} else {
		throw InternalException("Could not schedule task!");
	}
}